

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

bool gl4cts::CopyImage::Utils::isTargetMultilayer(GLenum target)

{
  if ((((target != 0x806f) && (target != 0x8c18)) && (target != 0x8c1a)) &&
     ((target != 0x9102 && (target != 0x9009)))) {
    return false;
  }
  return true;
}

Assistant:

bool Utils::isTargetMultilayer(GLenum target)
{
	bool result = false;

	switch (target)
	{
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	case GL_TEXTURE_3D:
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		result = true;
		break;

	default:
		break;
	}

	return result;
}